

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmlinuxalsa.c
# Opt level: O2

void handle_event(snd_seq_event_t *ev)

{
  uint uVar1;
  uint uVar2;
  PmInternal *midi;
  PmTimeProcPtr p_Var3;
  void *pvVar4;
  uchar *data;
  PmTimestamp PVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  size_t __n;
  undefined1 *__s;
  snd_seq_tick_time_t sVar9;
  code *pcStack_40;
  undefined1 auStack_38 [8];
  PmEvent local_30;
  PmEvent pm_ev;
  
  __s = auStack_38;
  midi = (PmInternal *)descriptors[(ev->dest).port].internalDescriptor;
  if (midi == (PmInternal *)0x0) {
    return;
  }
  if ((ev->flags & 1) != 0) {
    pcStack_40 = _fini;
    __assert_fail("(ev->flags & SND_SEQ_TIME_STAMP_MASK) == SND_SEQ_TIME_STAMP_TICK",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jwinarske[P]portmidi/pm_linux/pmlinuxalsa.c"
                  ,0x1f2,"void handle_event(snd_seq_event_t *)");
  }
  p_Var3 = midi->time_proc;
  if (p_Var3 == (PmTimeProcPtr)0x0) {
    sVar9 = (ev->time).tick;
  }
  else {
    pcStack_40 = (code *)0x104ec3;
    lVar8 = snd_seq_queue_status_sizeof();
    lVar8 = -(lVar8 + 0xfU & 0xfffffffffffffff0);
    __s = auStack_38 + lVar8;
    *(undefined8 *)(auStack_38 + lVar8 + -8) = 0x104ed9;
    __n = snd_seq_queue_status_sizeof();
    *(undefined8 *)(auStack_38 + lVar8 + -8) = 0x104ee6;
    memset(__s,0,__n);
    *(undefined8 *)(auStack_38 + lVar8 + -8) = 0x104efb;
    snd_seq_get_queue_status(seq,queue,__s);
    pvVar4 = midi->time_info;
    *(undefined8 *)(auStack_38 + lVar8 + -8) = 0x104f02;
    PVar5 = (*p_Var3)(pvVar4);
    sVar9 = (ev->time).tick;
    *(undefined8 *)(auStack_38 + lVar8 + -8) = 0x104f11;
    iVar6 = snd_seq_queue_status_get_tick_time(__s);
    sVar9 = (PVar5 + sVar9) - iVar6;
  }
  local_30.timestamp = sVar9;
  switch(ev->type) {
  case '\x06':
    local_30.message =
         (uint)(ev->data).note.channel |
         ((ev->data).note.note & 0x7f) << 8 | ((ev->data).note.velocity & 0x7f) << 0x10 | 0x90;
    break;
  case '\a':
    local_30.message =
         (uint)(ev->data).note.channel |
         ((ev->data).note.note & 0x7f) << 8 | ((ev->data).note.velocity & 0x7f) << 0x10 | 0x80;
    break;
  case '\b':
    local_30.message =
         (uint)(ev->data).note.channel |
         ((ev->data).note.note & 0x7f) << 8 | ((ev->data).note.velocity & 0x7f) << 0x10 | 0xa0;
    break;
  case '\t':
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
  case '\x17':
  case '\x18':
  case '\x19':
  case '\x1a':
  case '\x1b':
  case '\x1c':
  case '\x1d':
  case '!':
  case '\"':
  case '#':
  case '%':
  case '&':
  case '\'':
    goto switchD_00104f38_caseD_9;
  case '\n':
    uVar2 = (ev->data).raw32.d[2];
    uVar7 = ((ev->data).note.duration & 0x7f) << 8;
LAB_00105183:
    local_30.message = (uint)(ev->data).note.channel | uVar7 | (uVar2 & 0x7f) << 0x10 | 0xb0;
    break;
  case '\v':
    local_30.message = (uint)(ev->data).note.channel | ((ev->data).raw32.d[2] & 0x7f) << 8 | 0xc0;
    break;
  case '\f':
    local_30.message = (uint)(ev->data).note.channel | ((ev->data).raw32.d[2] & 0x7f) << 8 | 0xd0;
    break;
  case '\r':
    uVar1 = (ev->data).raw32.d[2];
    local_30.message =
         ((uint)(ev->data).note.channel | (uVar1 & 0x7f) << 8 | (uVar1 & 0x3f80) << 9 | 0xe0) ^
         0x400000;
    break;
  case '\x0e':
    uVar1 = (ev->data).note.duration;
    uVar2 = (ev->data).raw32.d[2];
    uVar7 = uVar1 << 8;
    if (0x1f < uVar1) {
      uVar7 = uVar7 & 0x7f00;
      goto LAB_00105183;
    }
    local_30.message = uVar7 | 0xb0 | (uint)(ev->data).note.channel | (uVar2 & 0x3f80) << 9;
    *(undefined8 *)(__s + -8) = 0x1050ca;
    pm_read_short(midi,&local_30);
    local_30.message =
         (uint)(ev->data).note.channel |
         (ev->data).note.duration * 0x100 + 0x2000 & 0xffff | ((ev->data).raw32.d[2] & 0x7f) << 0x10
         | 0xb0;
    break;
  case '\x14':
    uVar1 = (ev->data).raw32.d[2];
    local_30.message = (uVar1 & 0x7f) * 0x100 + (uVar1 & 0x3f80) * 0x200 + 0xf2;
    break;
  case '\x15':
    local_30.message = ((ev->data).raw32.d[2] & 0x7f) << 8 | 0xf3;
    break;
  case '\x16':
    local_30.message = ((ev->data).raw32.d[2] & 0x7f) << 8 | 0xf1;
    break;
  case '\x1e':
    local_30.message = 0xfa;
    break;
  case '\x1f':
    local_30.message = 0xfb;
    break;
  case ' ':
    local_30.message = 0xfc;
    break;
  case '$':
    local_30.message = 0xf8;
    break;
  case '(':
    local_30.message = 0xf6;
    break;
  case ')':
    local_30.message = 0xff;
    break;
  case '*':
    local_30.message = 0xfe;
    break;
  default:
    if (ev->type == 0x82) {
      data = (uchar *)(ev->data).ext.ptr;
      iVar6 = (ev->data).result.event;
      *(undefined8 *)(__s + -8) = 0x104f82;
      pm_read_bytes(midi,data,iVar6,sVar9);
    }
    goto switchD_00104f38_caseD_9;
  }
  *(undefined8 *)(__s + -8) = 0x1051a0;
  pm_read_short(midi,&local_30);
switchD_00104f38_caseD_9:
  return;
}

Assistant:

static void handle_event(snd_seq_event_t *ev)
{
    int device_id = ev->dest.port;
    PmInternal *midi = descriptors[device_id].internalDescriptor;
    // There is a race condition when closing a device and
    // continuing to poll other open devices. The closed device may
    // have outstanding events from before the close operation.
    if (!midi) {
        return;
    }
    PmEvent pm_ev;
    PmTimeProcPtr time_proc = midi->time_proc;
    PmTimestamp timestamp;

    /* time stamp should be in ticks, using our queue where 1 tick = 1ms */
    assert((ev->flags & SND_SEQ_TIME_STAMP_MASK) == SND_SEQ_TIME_STAMP_TICK);

    /* if no time_proc, just return "native" ticks (ms) */
    if (time_proc == NULL) {
        timestamp = ev->time.tick;
    } else { /* translate time to time_proc basis */
        snd_seq_queue_status_t *queue_status;
        snd_seq_queue_status_alloca(&queue_status);
        snd_seq_get_queue_status(seq, queue, queue_status);
        /* return (now - alsa_now) + alsa_timestamp */
        timestamp = (*time_proc)(midi->time_info) + ev->time.tick -
                    snd_seq_queue_status_get_tick_time(queue_status);
    }
    pm_ev.timestamp = timestamp;
    switch (ev->type) {
    case SND_SEQ_EVENT_NOTEON:
        pm_ev.message = Pm_Message(0x90 | ev->data.note.channel,
                                   ev->data.note.note & 0x7f,
                                   ev->data.note.velocity & 0x7f);
        pm_read_short(midi, &pm_ev);
        break;
    case SND_SEQ_EVENT_NOTEOFF:
        pm_ev.message = Pm_Message(0x80 | ev->data.note.channel,
                                   ev->data.note.note & 0x7f,
                                   ev->data.note.velocity & 0x7f);
        pm_read_short(midi, &pm_ev);
        break;
    case SND_SEQ_EVENT_KEYPRESS:
        pm_ev.message = Pm_Message(0xa0 | ev->data.note.channel,
                                   ev->data.note.note & 0x7f,
                                   ev->data.note.velocity & 0x7f);
        pm_read_short(midi, &pm_ev);
        break;
    case SND_SEQ_EVENT_CONTROLLER:
        pm_ev.message = Pm_Message(0xb0 | ev->data.note.channel,
                                   ev->data.control.param & 0x7f,
                                   ev->data.control.value & 0x7f);
        pm_read_short(midi, &pm_ev);
        break;
    case SND_SEQ_EVENT_PGMCHANGE:
        pm_ev.message = Pm_Message(0xc0 | ev->data.note.channel,
                                   ev->data.control.value & 0x7f, 0);
        pm_read_short(midi, &pm_ev);
        break;
    case SND_SEQ_EVENT_CHANPRESS:
        pm_ev.message = Pm_Message(0xd0 | ev->data.note.channel,
                                   ev->data.control.value & 0x7f, 0);
        pm_read_short(midi, &pm_ev);
        break;
    case SND_SEQ_EVENT_PITCHBEND:
        pm_ev.message = Pm_Message(0xe0 | ev->data.note.channel,
                            (ev->data.control.value + 0x2000) & 0x7f,
                            ((ev->data.control.value + 0x2000) >> 7) & 0x7f);
        pm_read_short(midi, &pm_ev);
        break;
    case SND_SEQ_EVENT_CONTROL14:
        if (ev->data.control.param < 0x20) {
            pm_ev.message = Pm_Message(0xb0 | ev->data.note.channel,
                                       ev->data.control.param,
                                       (ev->data.control.value >> 7) & 0x7f);
            pm_read_short(midi, &pm_ev);
            pm_ev.message = Pm_Message(0xb0 | ev->data.note.channel,
                                       ev->data.control.param + 0x20,
                                       ev->data.control.value & 0x7f);
            pm_read_short(midi, &pm_ev);
        } else {
            pm_ev.message = Pm_Message(0xb0 | ev->data.note.channel,
                                       ev->data.control.param & 0x7f,
                                       ev->data.control.value & 0x7f);

            pm_read_short(midi, &pm_ev);
        }
        break;
    case SND_SEQ_EVENT_SONGPOS:
        pm_ev.message = Pm_Message(0xf2,
                                   ev->data.control.value & 0x7f,
                                   (ev->data.control.value >> 7) & 0x7f);
        pm_read_short(midi, &pm_ev);
        break;
    case SND_SEQ_EVENT_SONGSEL:
        pm_ev.message = Pm_Message(0xf3,
                                   ev->data.control.value & 0x7f, 0);
        pm_read_short(midi, &pm_ev);
        break;
    case SND_SEQ_EVENT_QFRAME:
        pm_ev.message = Pm_Message(0xf1,
                                   ev->data.control.value & 0x7f, 0);
        pm_read_short(midi, &pm_ev);
        break;
    case SND_SEQ_EVENT_START:
        pm_ev.message = Pm_Message(0xfa, 0, 0);
        pm_read_short(midi, &pm_ev);
        break;
    case SND_SEQ_EVENT_CONTINUE:
        pm_ev.message = Pm_Message(0xfb, 0, 0);
        pm_read_short(midi, &pm_ev);
        break;
    case SND_SEQ_EVENT_STOP:
        pm_ev.message = Pm_Message(0xfc, 0, 0);
        pm_read_short(midi, &pm_ev);
        break;
    case SND_SEQ_EVENT_CLOCK:
        pm_ev.message = Pm_Message(0xf8, 0, 0);
        pm_read_short(midi, &pm_ev);
        break;
    case SND_SEQ_EVENT_TUNE_REQUEST:
        pm_ev.message = Pm_Message(0xf6, 0, 0);
        pm_read_short(midi, &pm_ev);
        break;
    case SND_SEQ_EVENT_RESET:
        pm_ev.message = Pm_Message(0xff, 0, 0);
        pm_read_short(midi, &pm_ev);
        break;
    case SND_SEQ_EVENT_SENSING:
        pm_ev.message = Pm_Message(0xfe, 0, 0);
        pm_read_short(midi, &pm_ev);
        break;
    case SND_SEQ_EVENT_SYSEX: {
        const BYTE *ptr = (const BYTE *) ev->data.ext.ptr;
        /* assume there is one sysex byte to process */
        pm_read_bytes(midi, ptr, ev->data.ext.len, timestamp);
        break;
    }
    }
}